

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O1

int Ivy_ManCheckFanoutNums(Ivy_Man_t *p)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  
  lVar2 = (long)p->vObjs->nSize;
  if (lVar2 < 1) {
    uVar4 = 0;
  }
  else {
    lVar3 = 0;
    uVar4 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar3];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 8) & 0xf) - 7)) {
        uVar4 = uVar4 + (*(int *)((long)pvVar1 + 0xc) == 0);
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  if (uVar4 != 0) {
    printf("Sequential AIG has %d dangling nodes.\n",(ulong)uVar4);
  }
  return uVar4;
}

Assistant:

int Ivy_ManCheckFanoutNums( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, Counter = 0;
    Ivy_ManForEachObj( p, pObj, i )
        if ( Ivy_ObjIsNode(pObj) )
            Counter += (Ivy_ObjRefs(pObj) == 0);
    if ( Counter )
        printf( "Sequential AIG has %d dangling nodes.\n", Counter );
    return Counter;
}